

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *node;
  TestNode *pTVar4;
  DrawMethod method;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  long lVar6;
  string desc;
  string name;
  string local_70;
  string local_50;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "draw_range_elements","Test drawRangeElements");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar6 = 0;
  uVar5 = extraout_RDX;
  do {
    uVar1 = *(uint *)((long)&DAT_01c331c0 + lVar6);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar1,(DrawMethod)uVar5);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar1,method);
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c010;
    *(uint *)&pTVar4[1].m_testCtx = uVar1;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    uVar5 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_RDX_02;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"random","random draw commands.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215c0b0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_max_over_bounds","Range over buffer bounds"
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x21000000000000;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_max_over_bounds_near_signed_wrap",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x7fffffff00000000;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_max_over_bounds_near_unsigned_wrap",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0xffffffff00000000;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_max_over_bounds_near_max",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0x100;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_min_max_over_bounds",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x21000000200000;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_min_max_over_bounds_near_signed_wrap",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x7fffffff7ffffff0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_min_max_over_bounds_near_unsigned_wrap",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)&DAT_fffffffffffffff0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"range_min_max_over_bounds_near_max",
             "Range over buffer bounds");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawInvalidRangeCase_0215c100;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
  *(undefined2 *)&pTVar3[1].m_name._M_string_length = 0x101;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild(node,pTVar3);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");
	tcu::TestCaseGroup* const drawRangeGroup	= new tcu::TestCaseGroup(m_testCtx, "draw_range_elements", "Test drawRangeElements");

	addChild(unalignedGroup);
	addChild(drawRangeGroup);

	// .unaligned_data
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			unalignedGroup->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}

		// Random

		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

	// .draw_range_elements
	{
		// use a larger range than the buffer size is
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds",							"Range over buffer bounds",	0x00000000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_signed_wrap",			"Range over buffer bounds",	0x00000000,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_unsigned_wrap",		"Range over buffer bounds",	0x00000000,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_max",					"Range over buffer bounds",	0x00000000, 0x00000000, false, true));

		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds",						"Range over buffer bounds",	0x00200000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_signed_wrap",		"Range over buffer bounds",	0x7FFFFFF0,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_unsigned_wrap",	"Range over buffer bounds",	0xFFFFFFF0,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_max",				"Range over buffer bounds",	0x00000000, 0x00000000, true, true));
	}
}